

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::SetEndPoint(ON_PolyCurve *this,ON_3dPoint end_point)

{
  int iVar1;
  ON_Curve *pOVar2;
  ON_Curve *c;
  bool rc;
  ON_PolyCurve *this_local;
  
  c._7_1_ = false;
  pOVar2 = LastSegmentCurve(this);
  if (pOVar2 != (ON_Curve *)0x0) {
    iVar1 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3a])();
    c._7_1_ = (bool)((byte)iVar1 & 1);
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return c._7_1_;
}

Assistant:

bool ON_PolyCurve::SetEndPoint(ON_3dPoint end_point)
{
  bool rc = false;
  // just do it // if ( !IsClosed() )
  {
    ON_Curve* c = LastSegmentCurve();
    if ( c )
      rc = c->SetEndPoint(end_point);
  }
	DestroyCurveTree();
  return rc;
}